

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int DisconnectPololux(POLOLU *pPololu)

{
  int iVar1;
  int local_1c;
  int res;
  int id;
  POLOLU *pPololu_local;
  
  local_1c = 0;
  do {
    if ((POLOLU *)addrsPololu[local_1c] == pPololu) {
      iVar1 = DisconnectPololu(pPololu);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsPololu[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectPololux(POLOLU* pPololu)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsPololu[id] != pPololu)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectPololu(pPololu);
	if (res != EXIT_SUCCESS) return res;

	addrsPololu[id] = NULL;

	return EXIT_SUCCESS;
}